

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcRobustBufferAccessBehaviorTests.cpp
# Opt level: O1

void deqp::RobustBufferAccessBehavior::Texture::SubImage
               (Functions *gl,GLenum target,GLint level,GLint x,GLint y,GLint z,GLsizei width,
               GLsizei height,GLsizei depth,GLenum format,GLenum type,GLvoid *pixels)

{
  GLenum err;
  TestError *this;
  int line;
  char *msg;
  
  if ((int)target < 0x84f5) {
    if (target == 0xde0) {
      (*gl->texSubImage1D)(0xde0,level,x,width,format,type,pixels);
      err = (*gl->getError)();
      msg = "TexSubImage1D";
      line = 0x389;
      goto LAB_00d9f46d;
    }
    if (target != 0xde1) {
      if (target != 0x806f) goto LAB_00d9f353;
      goto LAB_00d9f3a8;
    }
  }
  else if ((int)target < 0x8c18) {
    if (target != 0x84f5) {
      if (target != 0x8513) {
LAB_00d9f353:
        this = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this,"Invliad enum",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                   ,0x3a0);
        __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      (*gl->texSubImage2D)(0x8515,level,x,y,width,height,format,type,pixels);
      (*gl->texSubImage2D)(0x8516,level,x,y,width,height,format,type,pixels);
      (*gl->texSubImage2D)(0x8517,level,x,y,width,height,format,type,pixels);
      (*gl->texSubImage2D)(0x8518,level,x,y,width,height,format,type,pixels);
      (*gl->texSubImage2D)(0x8519,level,x,y,width,height,format,type,pixels);
      (*gl->texSubImage2D)(0x851a,level,x,y,width,height,format,type,pixels);
      err = (*gl->getError)();
      msg = "TexSubImage2D";
      line = 0x398;
      goto LAB_00d9f46d;
    }
  }
  else if (target != 0x8c18) {
    if (target != 0x8c1a) goto LAB_00d9f353;
LAB_00d9f3a8:
    (*gl->texSubImage3D)(target,level,x,y,z,width,height,depth,format,type,pixels);
    err = (*gl->getError)();
    msg = "TexSubImage3D";
    line = 0x39d;
    goto LAB_00d9f46d;
  }
  (*gl->texSubImage2D)(target,level,x,y,width,height,format,type,pixels);
  err = (*gl->getError)();
  msg = "TexSubImage2D";
  line = 0x38f;
LAB_00d9f46d:
  glu::checkError(err,msg,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                  ,line);
  return;
}

Assistant:

void Texture::SubImage(const glw::Functions& gl, glw::GLenum target, glw::GLint level, glw::GLint x, glw::GLint y,
					   glw::GLint z, glw::GLsizei width, glw::GLsizei height, glw::GLsizei depth, glw::GLenum format,
					   glw::GLenum type, const glw::GLvoid* pixels)
{
	switch (target)
	{
	case GL_TEXTURE_1D:
		gl.texSubImage1D(target, level, x, width, format, type, pixels);
		GLU_EXPECT_NO_ERROR(gl.getError(), "TexSubImage1D");
		break;
	case GL_TEXTURE_1D_ARRAY:
	case GL_TEXTURE_2D:
	case GL_TEXTURE_RECTANGLE:
		gl.texSubImage2D(target, level, x, y, width, height, format, type, pixels);
		GLU_EXPECT_NO_ERROR(gl.getError(), "TexSubImage2D");
		break;
	case GL_TEXTURE_CUBE_MAP:
		gl.texSubImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_X, level, x, y, width, height, format, type, pixels);
		gl.texSubImage2D(GL_TEXTURE_CUBE_MAP_NEGATIVE_X, level, x, y, width, height, format, type, pixels);
		gl.texSubImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_Y, level, x, y, width, height, format, type, pixels);
		gl.texSubImage2D(GL_TEXTURE_CUBE_MAP_NEGATIVE_Y, level, x, y, width, height, format, type, pixels);
		gl.texSubImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_Z, level, x, y, width, height, format, type, pixels);
		gl.texSubImage2D(GL_TEXTURE_CUBE_MAP_NEGATIVE_Z, level, x, y, width, height, format, type, pixels);
		GLU_EXPECT_NO_ERROR(gl.getError(), "TexSubImage2D");
		break;
	case GL_TEXTURE_3D:
	case GL_TEXTURE_2D_ARRAY:
		gl.texSubImage3D(target, level, x, y, z, width, height, depth, format, type, pixels);
		GLU_EXPECT_NO_ERROR(gl.getError(), "TexSubImage3D");
		break;
	default:
		TCU_FAIL("Invliad enum");
		break;
	}
}